

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool contentOnly)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetOutputName(&local_50,this,config,false);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BUNDLE_EXTENSION","");
  pcVar3 = cmTarget::GetProperty(this->Target,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 == (char *)0x0) {
    IsXCTestOnApple(this);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar2 = cmMakefile::PlatformIsAppleIos(this->Makefile);
  if ((!bVar2) && (std::__cxx11::string::append((char *)__return_storage_ptr__), !contentOnly)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(const std::string& config,
                                                    bool contentOnly) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".";
  const char *ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext)
    {
    if (this->IsXCTestOnApple())
      {
      ext = "xctest";
      }
    else
      {
      ext = "bundle";
      }
    }
  fpath += ext;
  if(!this->Makefile->PlatformIsAppleIos())
  {
    fpath += "/Contents";
    if(!contentOnly)
      fpath += "/MacOS";
  }
  return fpath;
}